

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O1

string * Game::Graphics::InputCommandListFooterPrompt_abi_cxx11_(void)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  string *in_RDI;
  ostringstream str_os;
  undefined1 auStack_1b8 [8];
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = in_RDI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar2 = 0;
  do {
    __s = *(char **)((long)&DAT_0011ad18 + lVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
}

Assistant:

std::string InputCommandListFooterPrompt() {
  constexpr auto sp = "  ";
  const auto input_commands_list_footer_text = {
      "", "Press the keys to start and continue.", "\n"};
  std::ostringstream str_os;
  for (const auto txt : input_commands_list_footer_text) {
    str_os << sp << txt << "\n";
  }
  return str_os.str();
}